

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17b8f50::BlendA64MaskTestHBD_d16_DISABLED_Speed_Test::TestBody
          (BlendA64MaskTestHBD_d16_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int bsize;
  int block_size;
  long lVar4;
  
  this_00 = &(this->super_BlendA64MaskTestHBD_d16).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
             .rng_;
  for (block_size = 0; block_size != 0x16; block_size = block_size + 1) {
    iVar3 = 8;
    while ((this->super_BlendA64MaskTestHBD_d16).bit_depth_ = iVar3, iVar3 < 0xd) {
      for (lVar4 = 0x3c024; lVar4 != 0x50024; lVar4 = lVar4 + 1) {
        uVar1 = libaom_test::ACMRandom::Rand12(this_00);
        *(short *)((long)this + lVar4 * 2 + -0x78010) =
             (short)((long)(ulong)uVar1 %
                    (long)(1 << ((byte)(this->super_BlendA64MaskTestHBD_d16).bit_depth_ & 0x1f)));
        uVar1 = libaom_test::ACMRandom::Rand12(this_00);
        *(short *)((long)this + lVar4 * 2 + -0x50010) =
             (short)((long)(ulong)uVar1 %
                    (long)(1 << ((byte)(this->super_BlendA64MaskTestHBD_d16).bit_depth_ & 0x1f)));
        uVar1 = libaom_test::ACMRandom::Rand16(this_00);
        *(uint16_t *)((long)this + lVar4 * 2 + -0x28008) = uVar1;
        uVar1 = libaom_test::ACMRandom::Rand16(this_00);
        (this->super_BlendA64MaskTestHBD_d16).
        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
        .dst_ref_[lVar4 + -0x1c] = uVar1;
      }
      for (lVar4 = 0xa0050; lVar4 != 0xb0050; lVar4 = lVar4 + 1) {
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x41);
        *(char *)((long)(this->super_BlendA64MaskTestHBD_d16).
                        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
                        .dst_ref_ + lVar4 + -0x38) = (char)uVar2;
      }
      BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
      ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
                 *)this,block_size,10000000);
      iVar3 = (this->super_BlendA64MaskTestHBD_d16).bit_depth_ + 2;
    }
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTestHBD_d16, DISABLED_Speed) {
  const int kRunTimes = 10000000;
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_.Rand12() % (1 << bit_depth_);
        dst_tst_[i] = rng_.Rand12() % (1 << bit_depth_);

        src0_[i] = rng_.Rand16();
        src1_[i] = rng_.Rand16();
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      RunTest(bsize, kRunTimes);
    }
  }
}